

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderStateQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::BaseTypeCase::iterate(BaseTypeCase *this)

{
  code *pcVar1;
  GLenum GVar2;
  bool bVar3;
  GLSLVersion version;
  int iVar4;
  deUint32 dVar5;
  TestLog *pTVar6;
  RenderContext *pRVar7;
  ContextInfo *this_00;
  NotSupportedError *this_01;
  size_type sVar8;
  reference pvVar9;
  mapped_type *pmVar10;
  char *pcVar11;
  undefined4 extraout_var;
  ProgramSources *pPVar12;
  MessageBuilder *pMVar13;
  ostream *poVar14;
  Enum<int,_2UL> EVar15;
  string local_ae0;
  ostringstream local_ac0 [8];
  ostringstream buf;
  MessageBuilder local_948;
  GLenum local_7c4 [2];
  GLint type;
  GLuint uniformIndex;
  int local_798;
  allocator<char> local_791;
  int uniforms;
  GetNameFunc local_770;
  int local_768;
  Enum<int,_2UL> local_760;
  MessageBuilder local_750;
  ShaderSource local_5d0;
  ShaderSource local_5a8;
  ProgramSources local_580;
  undefined1 local_4b0 [8];
  ShaderProgram program;
  Functions *gl;
  string local_3d0;
  StringTemplate local_3b0;
  undefined1 local_390 [8];
  string vertexSource;
  string local_368;
  StringTemplate local_348;
  undefined1 local_328 [8];
  string fragmentSource;
  key_type local_300;
  ApiType local_2e0;
  allocator<char> local_2d9;
  key_type local_2d8;
  byte local_2b5;
  allocator<char> local_2b4;
  byte local_2b3;
  byte local_2b2;
  byte local_2b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  allocator<char> local_229;
  key_type local_228;
  allocator<char> local_201;
  key_type local_200;
  undefined1 local_1e0 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  shaderArgs;
  GetNameFunc local_1a0;
  int local_198;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  GetNameFunc local_150;
  int local_148;
  GetNameFunc local_140;
  int local_138;
  string local_130;
  ScopedLogSection local_110;
  ScopedLogSection section;
  int typeNdx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  deUint32 local_bc;
  ContextType local_b8;
  byte local_b1;
  undefined1 local_b0 [7];
  bool supportsES32;
  vector<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
  samplerTypes;
  allocator<char> local_81;
  string local_80;
  undefined1 local_60 [8];
  ResultCollector result;
  BaseTypeCase *this_local;
  
  result.m_message.field_2._8_8_ = this;
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"",&local_81);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_60,pTVar6,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(local_b0);
  pRVar7 = Context::getRenderContext((this->super_TestCase).m_context);
  local_b8.super_ApiType.m_bits = (ApiType)(*pRVar7->_vptr_RenderContext[2])();
  local_bc = (deUint32)glu::ApiType::es(3,2);
  local_b1 = glu::contextSupports(local_b8,(ApiType)local_bc);
  if (this->m_extension != (char *)0x0) {
    this_00 = Context::getContextInfo((this->super_TestCase).m_context);
    bVar3 = glu::ContextInfo::isExtensionSupported(this_00,this->m_extension);
    if ((!bVar3) && ((local_b1 & 1) == 0)) {
      section.m_log._6_1_ = 1;
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      pcVar11 = this->m_extension;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&typeNdx,pcVar11,(allocator<char> *)((long)&section.m_log + 7));
      std::operator+(&local_e0,"Test requires ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&typeNdx);
      tcu::NotSupportedError::NotSupportedError(this_01,&local_e0);
      section.m_log._6_1_ = 0;
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])();
  for (section.m_log._0_4_ = 0; iVar4 = (int)section.m_log,
      sVar8 = std::
              vector<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
              ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
                      *)local_b0), iVar4 < (int)sVar8; section.m_log._0_4_ = (int)section.m_log + 1)
  {
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    pvVar9 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
             ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
                           *)local_b0,(long)(int)section.m_log);
    EVar15 = glu::getShaderVarTypeStr(pvVar9->glType);
    local_150 = EVar15.m_getName;
    local_148 = EVar15.m_value;
    local_140 = local_150;
    local_138 = local_148;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_130,&local_140);
    pvVar9 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
             ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
                           *)local_b0,(long)(int)section.m_log);
    EVar15 = glu::getShaderVarTypeStr(pvVar9->glType);
    shaderArgs._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)EVar15.m_getName;
    local_198 = EVar15.m_value;
    local_1a0 = (GetNameFunc)shaderArgs._M_t._M_impl.super__Rb_tree_header._M_node_count;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_190,&local_1a0);
    std::operator+(&local_170,"Uniform type ",&local_190);
    tcu::ScopedLogSection::ScopedLogSection(&local_110,pTVar6,&local_130,&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_130);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_1e0);
    pvVar9 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
             ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
                           *)local_b0,(long)(int)section.m_log);
    pcVar11 = pvVar9->declarationStr;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,"DECLARATIONSTR",&local_201);
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_1e0,&local_200);
    std::__cxx11::string::operator=((string *)pmVar10,pcVar11);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator(&local_201);
    pvVar9 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
             ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
                           *)local_b0,(long)(int)section.m_log);
    pcVar11 = pvVar9->accessStr;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"ACCESSSTR",&local_229);
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_1e0,&local_228);
    std::__cxx11::string::operator=((string *)pmVar10,pcVar11);
    std::__cxx11::string::~string((string *)&local_228);
    std::allocator<char>::~allocator(&local_229);
    local_2b1 = 0;
    local_2b2 = 0;
    local_2b3 = 0;
    local_2b5 = 0;
    if ((this->m_extension == (char *)0x0) || ((local_b1 & 1) != 0)) {
      std::allocator<char>::allocator();
      local_2b5 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"",&local_2b4);
    }
    else {
      std::__cxx11::string::string((string *)&local_2b0);
      local_2b1 = 1;
      std::operator+(&local_290,&local_2b0,"#extension ");
      local_2b2 = 1;
      std::operator+(&local_270,&local_290,this->m_extension);
      local_2b3 = 1;
      std::operator+(&local_250,&local_270," : require\n");
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d8,"EXTENSIONSTATEMENT",&local_2d9);
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_1e0,&local_2d8);
    std::__cxx11::string::operator=((string *)pmVar10,(string *)&local_250);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::allocator<char>::~allocator(&local_2d9);
    std::__cxx11::string::~string((string *)&local_250);
    if ((local_2b5 & 1) != 0) {
      std::allocator<char>::~allocator(&local_2b4);
    }
    if ((local_2b3 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_270);
    }
    if ((local_2b2 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_290);
    }
    if ((local_2b1 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_2b0);
    }
    pRVar7 = Context::getRenderContext((this->super_TestCase).m_context);
    local_2e0.m_bits = (*pRVar7->_vptr_RenderContext[2])();
    version = glu::getContextTypeGLSLVersion((ContextType)local_2e0.m_bits);
    pcVar11 = glu::getGLSLVersionDeclaration(version);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,"VERSIONDECL",
               (allocator<char> *)(fragmentSource.field_2._M_local_buf + 0xf));
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_1e0,&local_300);
    std::__cxx11::string::operator=((string *)pmVar10,pcVar11);
    std::__cxx11::string::~string((string *)&local_300);
    std::allocator<char>::~allocator((allocator<char> *)(fragmentSource.field_2._M_local_buf + 0xf))
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_368,
               "${VERSIONDECL}\n${EXTENSIONSTATEMENT}${DECLARATIONSTR};\nlayout(location = 0) out highp vec4 dEQP_FragColor;\nvoid main(void)\n{\n\tdEQP_FragColor = vec4(${ACCESSSTR});\n}\n"
               ,(allocator<char> *)(vertexSource.field_2._M_local_buf + 0xf));
    tcu::StringTemplate::StringTemplate(&local_348,&local_368);
    tcu::StringTemplate::specialize
              ((string *)local_328,&local_348,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_1e0);
    tcu::StringTemplate::~StringTemplate(&local_348);
    std::__cxx11::string::~string((string *)&local_368);
    std::allocator<char>::~allocator((allocator<char> *)(vertexSource.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3d0,
               "${VERSIONDECL}\nin highp vec4 a_position;\nvoid main(void)\n{\n\tgl_Position = a_position;\n}\n"
               ,(allocator<char> *)((long)&gl + 7));
    tcu::StringTemplate::StringTemplate(&local_3b0,&local_3d0);
    tcu::StringTemplate::specialize
              ((string *)local_390,&local_3b0,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_1e0);
    tcu::StringTemplate::~StringTemplate(&local_3b0);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&gl + 7));
    pRVar7 = Context::getRenderContext((this->super_TestCase).m_context);
    iVar4 = (*pRVar7->_vptr_RenderContext[3])();
    program.m_program.m_info.linkTimeUs = CONCAT44(extraout_var,iVar4);
    pRVar7 = Context::getRenderContext((this->super_TestCase).m_context);
    glu::ProgramSources::ProgramSources(&local_580);
    glu::VertexSource::VertexSource((VertexSource *)&local_5a8,(string *)local_390);
    pPVar12 = glu::ProgramSources::operator<<(&local_580,&local_5a8);
    glu::FragmentSource::FragmentSource((FragmentSource *)&local_5d0,(string *)local_328);
    pPVar12 = glu::ProgramSources::operator<<(pPVar12,&local_5d0);
    glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_4b0,pRVar7,pPVar12);
    glu::FragmentSource::~FragmentSource((FragmentSource *)&local_5d0);
    glu::VertexSource::~VertexSource((VertexSource *)&local_5a8);
    glu::ProgramSources::~ProgramSources(&local_580);
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_750,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar13 = tcu::MessageBuilder::operator<<
                        (&local_750,(char (*) [47])"Building program with uniform sampler of type ")
    ;
    pvVar9 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
             ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
                           *)local_b0,(long)(int)section.m_log);
    EVar15 = glu::getShaderVarTypeStr(pvVar9->glType);
    local_770 = EVar15.m_getName;
    local_768 = EVar15.m_value;
    local_760.m_getName = local_770;
    local_760.m_value = local_768;
    pMVar13 = tcu::MessageBuilder::operator<<(pMVar13,&local_760);
    tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_750);
    bVar3 = glu::ShaderProgram::isOk((ShaderProgram *)local_4b0);
    if (bVar3) {
      local_798 = 0;
      pcVar1 = *(code **)(program.m_program.m_info.linkTimeUs + 0x9d8);
      dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_4b0);
      (*pcVar1)(dVar5,0x8b86,&local_798);
      if (local_798 == 1) {
        local_7c4[1] = 0;
        local_7c4[0] = 0;
        pTVar6 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_948,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar13 = tcu::MessageBuilder::operator<<
                            (&local_948,(char (*) [24])"Verifying uniform type.");
        tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_948);
        pcVar1 = *(code **)(program.m_program.m_info.linkTimeUs + 0x770);
        dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_4b0);
        (*pcVar1)(dVar5,1,local_7c4 + 1,0x8a37,local_7c4);
        GVar2 = local_7c4[0];
        pvVar9 = std::
                 vector<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
                 ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
                               *)local_b0,(long)(int)section.m_log);
        if (GVar2 != pvVar9->glType) {
          std::__cxx11::ostringstream::ostringstream(local_ac0);
          poVar14 = std::operator<<((ostream *)local_ac0,"Invalid type, expected ");
          pvVar9 = std::
                   vector<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
                   ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
                                 *)local_b0,(long)(int)section.m_log);
          poVar14 = (ostream *)std::ostream::operator<<(poVar14,pvVar9->glType);
          poVar14 = std::operator<<(poVar14,", got ");
          std::ostream::operator<<(poVar14,local_7c4[0]);
          std::__cxx11::ostringstream::str();
          tcu::ResultCollector::fail((ResultCollector *)local_60,&local_ae0);
          std::__cxx11::string::~string((string *)&local_ae0);
          std::__cxx11::ostringstream::~ostringstream(local_ac0);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&uniformIndex,"Unexpected GL_ACTIVE_UNIFORMS, expected 1",
                   (allocator<char> *)((long)&type + 3));
        tcu::ResultCollector::fail((ResultCollector *)local_60,(string *)&uniformIndex);
        std::__cxx11::string::~string((string *)&uniformIndex);
        std::allocator<char>::~allocator((allocator<char> *)((long)&type + 3));
      }
    }
    else {
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      glu::operator<<(pTVar6,(ShaderProgram *)local_4b0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&uniforms,"could not build shader",&local_791);
      tcu::ResultCollector::fail((ResultCollector *)local_60,(string *)&uniforms);
      std::__cxx11::string::~string((string *)&uniforms);
      std::allocator<char>::~allocator(&local_791);
    }
    dVar5 = (**(code **)(program.m_program.m_info.linkTimeUs + 0x800))();
    glu::checkError(dVar5,"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderStateQueryTests.cpp"
                    ,0x9c);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_4b0);
    std::__cxx11::string::~string((string *)local_390);
    std::__cxx11::string::~string((string *)local_328);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_1e0);
    tcu::ScopedLogSection::~ScopedLogSection(&local_110);
  }
  tcu::ResultCollector::setTestContextResult
            ((ResultCollector *)local_60,
             (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
  ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
             *)local_b0);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_60);
  return STOP;
}

Assistant:

BaseTypeCase::IterateResult BaseTypeCase::iterate (void)
{
	static const char* const	vertexSourceTemplate	=	"${VERSIONDECL}\n"
															"in highp vec4 a_position;\n"
															"void main(void)\n"
															"{\n"
															"	gl_Position = a_position;\n"
															"}\n";
	static const char* const	fragmentSourceTemplate	=	"${VERSIONDECL}\n"
															"${EXTENSIONSTATEMENT}"
															"${DECLARATIONSTR};\n"
															"layout(location = 0) out highp vec4 dEQP_FragColor;\n"
															"void main(void)\n"
															"{\n"
															"	dEQP_FragColor = vec4(${ACCESSSTR});\n"
															"}\n";

	tcu::ResultCollector		result			(m_testCtx.getLog());
	std::vector<TestTypeInfo>	samplerTypes	= getInfos();
	const bool					supportsES32	= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (m_extension && !m_context.getContextInfo().isExtensionSupported(m_extension) && !supportsES32)
		throw tcu::NotSupportedError("Test requires " + std::string(m_extension));
	checkRequirements();

	for (int typeNdx = 0; typeNdx < (int)samplerTypes.size(); ++typeNdx)
	{
		const tcu::ScopedLogSection			section	(m_testCtx.getLog(),
													 std::string(glu::getShaderVarTypeStr(samplerTypes[typeNdx].glType).toString()),
													 "Uniform type " + glu::getShaderVarTypeStr(samplerTypes[typeNdx].glType).toString());

		std::map<std::string, std::string>	shaderArgs;
		shaderArgs["DECLARATIONSTR"]		= samplerTypes[typeNdx].declarationStr;
		shaderArgs["ACCESSSTR"]				= samplerTypes[typeNdx].accessStr;
		shaderArgs["EXTENSIONSTATEMENT"]	= (m_extension && !supportsES32) ? (std::string() + "#extension " + m_extension + " : require\n") : ("");
		shaderArgs["VERSIONDECL"]			= glu::getGLSLVersionDeclaration(glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType()));

		const std::string					fragmentSource	= tcu::StringTemplate(fragmentSourceTemplate).specialize(shaderArgs);
		const std::string					vertexSource	= tcu::StringTemplate(vertexSourceTemplate).specialize(shaderArgs);
		const glw::Functions&				gl				= m_context.getRenderContext().getFunctions();
		glu::ShaderProgram					program			(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(vertexSource) << glu::FragmentSource(fragmentSource));

		m_testCtx.getLog() << tcu::TestLog::Message << "Building program with uniform sampler of type " << glu::getShaderVarTypeStr(samplerTypes[typeNdx].glType) << tcu::TestLog::EndMessage;

		if (!program.isOk())
		{
			m_testCtx.getLog() << program;
			result.fail("could not build shader");
		}
		else
		{
			// only one uniform -- uniform at index 0
			int uniforms = 0;
			gl.getProgramiv(program.getProgram(), GL_ACTIVE_UNIFORMS, &uniforms);

			if (uniforms != 1)
				result.fail("Unexpected GL_ACTIVE_UNIFORMS, expected 1");
			else
			{
				// check type
				const glw::GLuint	uniformIndex	= 0;
				glw::GLint			type			= 0;

				m_testCtx.getLog() << tcu::TestLog::Message << "Verifying uniform type." << tcu::TestLog::EndMessage;
				gl.getActiveUniformsiv(program.getProgram(), 1, &uniformIndex, GL_UNIFORM_TYPE, &type);

				if (type != (glw::GLint)samplerTypes[typeNdx].glType)
				{
					std::ostringstream buf;
					buf << "Invalid type, expected " << samplerTypes[typeNdx].glType << ", got " << type;
					result.fail(buf.str());
				}
			}
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "");
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}